

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

bool EV_StopPoly(int polynum)

{
  DPolyAction *pDVar1;
  long lVar2;
  FPolyObj *pFVar3;
  
  lVar2 = (long)po_NumPolyobjs;
  pFVar3 = polyobjs;
  if (0 < lVar2) {
    do {
      if (pFVar3->tag == polynum) goto LAB_005607e8;
      lVar2 = lVar2 + -1;
      pFVar3 = pFVar3 + 1;
    } while (lVar2 != 0);
  }
  pFVar3 = (FPolyObj *)0x0;
LAB_005607e8:
  if ((pFVar3 != (FPolyObj *)0x0) &&
     (pDVar1 = (pFVar3->specialdata).field_0.p, pDVar1 != (DPolyAction *)0x0)) {
    if (((pDVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      DPolyAction::Stop((pFVar3->specialdata).field_0.p);
    }
    else {
      (pFVar3->specialdata).field_0.p = (DPolyAction *)0x0;
    }
  }
  return pFVar3 != (FPolyObj *)0x0;
}

Assistant:

bool EV_StopPoly(int polynum)
{
	FPolyObj *poly;

	if (NULL != (poly = PO_GetPolyobj(polynum)))
	{
		if (poly->specialdata != NULL)
		{
			poly->specialdata->Stop();
		}
		return true;
	}
	return false;
}